

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O3

int jpc_mqdec_lpsexchrenormd(jpc_mqdec_t *mqdec)

{
  _Bool _Var1;
  uchar uVar2;
  int iVar3;
  ulong uVar4;
  jpc_mqstate_t *pjVar5;
  ulong uVar6;
  jas_stream_t *stream;
  byte *pbVar7;
  uint_fast32_t uVar8;
  uint uVar9;
  uint_fast32_t uVar10;
  uint_fast32_t uVar11;
  
  uVar4 = mqdec->areg;
  pjVar5 = *mqdec->curctx;
  uVar6 = pjVar5->qeval;
  _Var1 = pjVar5->mps;
  mqdec->areg = uVar6;
  *mqdec->curctx = (&pjVar5->nmps)[uVar6 <= uVar4];
  uVar10 = mqdec->ctreg;
  do {
    if (uVar10 == 0) {
      if (mqdec->eof == 0) {
        stream = mqdec->in;
        if ((stream->flags_ & 7U) == 0) {
          if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
            stream->flags_ = stream->flags_ | 4;
            goto LAB_001236c0;
          }
          iVar3 = stream->cnt_;
          stream->cnt_ = iVar3 + -1;
          if (iVar3 < 1) {
            uVar9 = jas_stream_fillbuf(stream,1);
            if (uVar9 == 0xffffffff) goto LAB_001236c0;
          }
          else {
            stream->rwcnt_ = stream->rwcnt_ + 1;
            pbVar7 = stream->ptr_;
            stream->ptr_ = pbVar7 + 1;
            uVar9 = (uint)*pbVar7;
          }
          uVar2 = mqdec->inbuffer;
          mqdec->inbuffer = (uchar)uVar9;
          uVar11 = mqdec->creg;
          if (uVar2 != 0xff) goto LAB_0012373a;
          if ((int)uVar9 < 0x90) {
            uVar11 = uVar11 + (long)(int)(uVar9 << 9);
            uVar10 = 6;
            goto LAB_00123747;
          }
        }
        else {
LAB_001236c0:
          mqdec->eof = 1;
          uVar2 = mqdec->inbuffer;
          mqdec->inbuffer = 0xff;
          uVar11 = mqdec->creg;
          uVar9 = 0xff;
          if (uVar2 != 0xff) {
LAB_0012373a:
            uVar11 = uVar11 + (long)(int)(uVar9 << 8);
            goto LAB_00123742;
          }
        }
        uVar11 = uVar11 + 0xff00;
      }
      else {
        uVar11 = mqdec->creg + 0xff00;
      }
LAB_00123742:
      uVar10 = 7;
    }
    else {
      uVar11 = mqdec->creg;
      uVar10 = uVar10 - 1;
    }
LAB_00123747:
    uVar8 = mqdec->areg;
    mqdec->areg = uVar8 * 2;
    mqdec->creg = uVar11 * 2;
    mqdec->ctreg = uVar10;
    if (((uint)uVar8 >> 0xe & 1) != 0) {
      return (int)(byte)(_Var1 ^ uVar6 <= uVar4);
    }
  } while( true );
}

Assistant:

int jpc_mqdec_lpsexchrenormd(register jpc_mqdec_t *mqdec)
{
	int ret;
	register const jpc_mqstate_t *state = *mqdec->curctx;
	jpc_mqdec_lpsexchange(mqdec->areg, state->qeval, mqdec->curctx, ret);
	jpc_mqdec_renormd(mqdec->areg, mqdec->creg, mqdec->ctreg, mqdec->in,
	  mqdec->eof, mqdec->inbuffer);
	return ret;
}